

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ed25519_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *ctx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  if (veccount == 1) {
    session_local._4_4_ =
         _libssh2_ed25519_sign
                   ((EVP_PKEY *)*abstract,session,signature,signature_len,
                    (uint8_t *)datavec->iov_base,datavec->iov_len);
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_ed25519_signv(LIBSSH2_SESSION * session,
                                 unsigned char **signature,
                                 size_t *signature_len,
                                 int veccount,
                                 const struct iovec datavec[],
                                 void **abstract)
{
    libssh2_ed25519_ctx *ctx = (libssh2_ed25519_ctx *) (*abstract);

    if(veccount != 1) {
        return -1;
    }

    return _libssh2_ed25519_sign(ctx, session, signature, signature_len,
                                 (const uint8_t *)datavec[0].iov_base,
                                 datavec[0].iov_len);
}